

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O0

UINT16 TPM2B_NV_PUBLIC_Marshal(TPM2B_NV_PUBLIC *source,BYTE **buffer,INT32 *size)

{
  UINT16 UVar1;
  UINT16 UVar2;
  BYTE *local_30;
  BYTE *sizeField;
  INT32 *pIStack_20;
  UINT16 result;
  INT32 *size_local;
  BYTE **buffer_local;
  TPM2B_NV_PUBLIC *source_local;
  
  sizeField._6_2_ = 0;
  local_30 = *buffer;
  *buffer = *buffer + 2;
  pIStack_20 = size;
  size_local = (INT32 *)buffer;
  buffer_local = (BYTE **)source;
  UVar1 = TPMS_NV_PUBLIC_Marshal(&source->nvPublic,buffer,size);
  sizeField._6_2_ = UVar1;
  UVar2 = UINT16_Marshal((UINT16 *)((long)&sizeField + 6),&local_30,pIStack_20);
  return UVar1 + UVar2;
}

Assistant:

UINT16
TPM2B_NV_PUBLIC_Marshal(TPM2B_NV_PUBLIC *source, BYTE **buffer, INT32 *size)
{
    UINT16    result = 0;
    BYTE      *sizeField = *buffer;
    // Advance buffer pointer by canonical size of a UINT16
    *buffer += 2;
    // Marshal the structure
    result = (UINT16)(result + TPMS_NV_PUBLIC_Marshal((TPMS_NV_PUBLIC *)&(source->nvPublic), buffer, size));
    // Marshal the size
    result = (UINT16)(result + UINT16_Marshal(&result, &sizeField, size));
    return result;
}